

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cpp
# Opt level: O2

optional<long> __thiscall ArgsManager::GetIntArg(ArgsManager *this,string *strArg)

{
  undefined1 auVar1 [12];
  long in_FS_OFFSET;
  optional<long> oVar2;
  SettingsValue value;
  SettingsValue local_70;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  GetSetting(&local_70,this,strArg);
  oVar2 = SettingToInt(&local_70);
  UniValue::~UniValue(&local_70);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    auVar1 = oVar2.super__Optional_base<long,_true,_true>._M_payload.
             super__Optional_payload_base<long>._0_12_;
    oVar2.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
    _12_4_ = 0;
    oVar2.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
    _M_payload._M_value = auVar1._0_8_;
    oVar2.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
    _M_engaged = (bool)auVar1[8];
    oVar2.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>._9_3_
         = auVar1._9_3_;
    return (optional<long>)
           oVar2.super__Optional_base<long,_true,_true>._M_payload.
           super__Optional_payload_base<long>;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<int64_t> ArgsManager::GetIntArg(const std::string& strArg) const
{
    const common::SettingsValue value = GetSetting(strArg);
    return SettingToInt(value);
}